

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash>::clear
          (Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash> *this)

{
  Entry *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (in_RDI->_value != (MaybeUninit<Lib::List<Kernel::TermList>_*>)0x0) {
    array_delete<Lib::Map<unsigned_int,Lib::List<Kernel::TermList>*,Lib::DefaultHash>::Entry>
              (in_RDI,in_stack_ffffffffffffffe8);
    Lib::free((void *)in_RDI->_value);
  }
  in_RDI->code = 0;
  in_RDI->_key = (MaybeUninit<unsigned_int>)0x0;
  in_RDI->_value = (MaybeUninit<Lib::List<Kernel::TermList>_*>)0x0;
  in_RDI[1].code = 0;
  in_RDI[1]._key = (MaybeUninit<unsigned_int>)0x0;
  *(undefined4 *)&in_RDI[1]._value = 0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }